

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O2

void __thiscall
duckdb_shell::ModeLatexRenderer::RenderHeader(ModeLatexRenderer *this,ColumnarResult *result)

{
  ShellState *pSVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  idx_t i;
  ulong uVar5;
  
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"\\begin{tabular}{|");
  for (uVar5 = 0; pSVar1 = (this->super_ColumnRenderer).super_ShellRenderer.state,
      uVar5 < result->column_count; uVar5 = uVar5 + 1) {
    bVar3 = ShellState::ColumnTypeIsInteger
                      (pSVar1,(result->type_names).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar5]);
    pcVar2 = "+l";
    if (bVar3) {
      pcVar2 = "+r";
    }
    ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,pcVar2 + 1);
  }
  ShellState::Print(pSVar1,"|}\n");
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"\\hline\n");
  for (uVar5 = 0; uVar5 < result->column_count; uVar5 = uVar5 + 1) {
    ColumnRenderer::RenderAlignedValue(&this->super_ColumnRenderer,result,uVar5);
    pSVar1 = (this->super_ColumnRenderer).super_ShellRenderer.state;
    iVar4 = (*(this->super_ColumnRenderer).super_ShellRenderer._vptr_ShellRenderer
              [(ulong)(uVar5 == result->column_count - 1) + 4])(this);
    ShellState::Print(pSVar1,(char *)CONCAT44(extraout_var,iVar4));
  }
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,"\\hline\n");
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		state.Print("\\begin{tabular}{|");
		for (idx_t i = 0; i < result.column_count; i++) {
			if (state.ColumnTypeIsInteger(result.type_names[i])) {
				state.Print("r");
			} else {
				state.Print("l");
			}
		}
		state.Print("|}\n");
		state.Print("\\hline\n");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? GetRowSeparator() : GetColumnSeparator());
		}
		state.Print("\\hline\n");
	}